

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * gettxout(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe858;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe870;
  RPCResults *in_stack_ffffffffffffe880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe890;
  UniValue *in_stack_ffffffffffffe898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8a0;
  undefined7 in_stack_ffffffffffffe8a8;
  undefined1 in_stack_ffffffffffffe8af;
  string *in_stack_ffffffffffffe8b0;
  undefined7 in_stack_ffffffffffffe8b8;
  undefined1 in_stack_ffffffffffffe8bf;
  undefined4 in_stack_ffffffffffffe8c0;
  Type in_stack_ffffffffffffe8c4;
  string *in_stack_ffffffffffffe8c8;
  undefined4 in_stack_ffffffffffffe8d0;
  Type in_stack_ffffffffffffe8d4;
  undefined4 in_stack_ffffffffffffe8d8;
  Type in_stack_ffffffffffffe8dc;
  RPCResult *in_stack_ffffffffffffe8e0;
  undefined1 *local_16e0;
  undefined1 *local_16c8;
  undefined1 *local_16b0;
  undefined1 *local_1698;
  RPCExamples *examples;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  _Any_data *fun;
  undefined1 local_13f0 [34];
  allocator<char> local_13ce;
  allocator<char> local_13cd;
  allocator<char> local_13cc;
  allocator<char> local_13cb;
  undefined1 local_13ca [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_13c8;
  undefined1 local_13ab;
  undefined1 local_13aa [33];
  allocator<char> local_1389 [31];
  allocator<char> local_136a;
  allocator<char> local_1369 [31];
  allocator<char> local_134a;
  allocator<char> local_1349;
  size_type local_1348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1340;
  allocator<char> local_132a;
  allocator<char> local_1329;
  _Alloc_hider local_1328;
  size_type sStack_1320;
  undefined1 local_1318 [15];
  allocator<char> local_1309 [31];
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  allocator<char> local_12c9;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  allocator<char> local_12aa;
  allocator<char> local_12a9;
  _Any_data local_12a8;
  undefined8 local_1298;
  allocator<char> local_128a;
  allocator<char> local_1289 [30];
  allocator<char> local_126b;
  allocator<char> local_126a;
  allocator<char> local_1269;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  allocator<char> local_1243;
  allocator<char> local_1242;
  allocator<char> local_1241 [29];
  allocator<char> local_1224;
  undefined1 local_1223;
  allocator<char> local_1222;
  allocator<char> local_1221;
  undefined4 local_1220;
  allocator<char> local_121a;
  allocator<char> local_1219;
  undefined4 local_1218;
  allocator<char> local_1211 [31];
  allocator<char> local_11f2;
  allocator<char> local_11f1 [497];
  undefined8 local_1000;
  undefined1 local_e90 [680];
  undefined1 local_be8 [256];
  undefined1 local_ae8 [544];
  string local_8c8 [4];
  undefined1 local_840 [192];
  undefined1 local_780 [272];
  undefined1 local_670 [40];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined1 local_62f;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1218 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe868,&in_stack_ffffffffffffe860->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe870);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe858);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                 in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8),
                 in_stack_ffffffffffffe8b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1220 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe868,&in_stack_ffffffffffffe860->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe870);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe858);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                 in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8),
                 in_stack_ffffffffffffe8b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1223 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe898,(bool *)in_stack_ffffffffffffe890);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe868,in_stack_ffffffffffffe860);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_670[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe870);
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe858);
  local_630 = 0;
  local_62f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                 in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8),
                 in_stack_ffffffffffffe8b0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe858);
  __l._M_len._0_7_ = in_stack_ffffffffffffe8a8;
  __l._M_array = (iterator)in_stack_ffffffffffffe8a0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe8af;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe898,__l,
             (allocator_type *)in_stack_ffffffffffffe890);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1268 = 0;
  uStack_1260 = 0;
  local_1258 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,
             (string *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
             in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8c8,
             (string *)CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_12a8._M_unused._M_object = (void *)0x0;
  local_12a8._8_8_ = 0;
  local_1298 = 0;
  fun = &local_12a8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_12c8 = 0;
  uStack_12c0 = 0;
  local_12b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
                 in_stack_ffffffffffffe8a0);
  local_12e8 = 0;
  uStack_12e0 = 0;
  local_12d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1328._M_p = (pointer)0x0;
  sStack_1320 = 0;
  local_1318._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1348 = 0;
  aStack_1340._M_allocated_capacity = 0;
  aStack_1340._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1369._1_8_ = 0;
  local_1369._9_8_ = 0;
  local_1369[0x11] = (allocator<char>)0x0;
  local_1369[0x12] = (allocator<char>)0x0;
  local_1369[0x13] = (allocator<char>)0x0;
  local_1369[0x14] = (allocator<char>)0x0;
  local_1369[0x15] = (allocator<char>)0x0;
  local_1369[0x16] = (allocator<char>)0x0;
  local_1369[0x17] = (allocator<char>)0x0;
  local_1369[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_1389[1] = (allocator<char>)0x0;
  local_1389[2] = (allocator<char>)0x0;
  local_1389[3] = (allocator<char>)0x0;
  local_1389[4] = (allocator<char>)0x0;
  local_1389[5] = (allocator<char>)0x0;
  local_1389[6] = (allocator<char>)0x0;
  local_1389[7] = (allocator<char>)0x0;
  local_1389[8] = (allocator<char>)0x0;
  local_1389._9_8_ = 0;
  local_1389._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_13aa._2_8_ = 0;
  local_13aa._10_8_ = 0;
  local_13aa._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe858);
  this = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffe858 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
             in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8c8,
             SUB41(in_stack_ffffffffffffe8c4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe8b0,
             (bool)in_stack_ffffffffffffe8af);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe8a8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe8a0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe8af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe898,__l_00,
             (allocator_type *)in_stack_ffffffffffffe890);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  name = local_8c8;
  this_01 = (RPCHelpMan *)local_13aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  description = (string *)&local_13ab;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  local_13c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  args = &local_13c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
             (string *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
             in_stack_ffffffffffffe8c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (bool)in_stack_ffffffffffffe8bf);
  results_00 = (RPCResults *)(local_13ca + 1);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe8a8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe8a0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe8af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe898,__l_01,
             (allocator_type *)in_stack_ffffffffffffe890);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe8e0,
             (string *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
             in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8c8,
             (string *)CONCAT44(in_stack_ffffffffffffe8c4,in_stack_ffffffffffffe8c0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe8bf,in_stack_ffffffffffffe8b8));
  results._M_len._0_7_ = in_stack_ffffffffffffe8a8;
  results._M_array = (iterator)in_stack_ffffffffffffe8a0;
  results._M_len._7_1_ = in_stack_ffffffffffffe8af;
  RPCResults::RPCResults(in_stack_ffffffffffffe880,results);
  examples = (RPCExamples *)local_13ca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  HelpExampleCli(in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  std::operator+((char *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe868);
  std::operator+(in_stack_ffffffffffffe870,(char *)in_stack_ffffffffffffe868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  HelpExampleCli(in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  std::operator+(in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  std::operator+(in_stack_ffffffffffffe870,(char *)in_stack_ffffffffffffe868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe8af,in_stack_ffffffffffffe8a8),
             (char *)in_stack_ffffffffffffe8a0,(allocator<char> *)in_stack_ffffffffffffe898);
  HelpExampleRpc(in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  std::operator+(in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x55b234);
  this_00 = (RPCArg *)local_13f0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<gettxout()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffe868,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe860);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results_00,examples,(RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_13f0 + 0x21));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13ce);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13cd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13cc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_13cb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_13ca);
  RPCResults::~RPCResults((RPCResults *)this_00);
  local_1698 = local_670;
  do {
    local_1698 = local_1698 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1698 != local_780);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_16b0 = local_840;
  do {
    local_16b0 = local_16b0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_16b0 != local_ae8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_13ab);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_13aa);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_16c8 = local_be8;
  do {
    local_16c8 = local_16c8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_16c8 != local_e90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_13aa + 0x20));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1389);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_136a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1369);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_134a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1349);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_132a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1329);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1318 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1309);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12ea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12aa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_12a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_128a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1289);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_126b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_126a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1269);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe868);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1243);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1242);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1241);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe868);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_16e0 = local_48;
  do {
    local_16e0 = local_16e0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_16e0 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1224);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1222);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1221);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_121a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1219);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1211);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_11f2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_11f1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxout()
{
    return RPCHelpMan{"gettxout",
        "\nReturns details about an unspent transaction output.\n",
        {
            {"txid", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction id"},
            {"n", RPCArg::Type::NUM, RPCArg::Optional::NO, "vout number"},
            {"include_mempool", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether to include the mempool. Note that an unspent output that is spent in the mempool won't appear."},
        },
        {
            RPCResult{"If the UTXO was not found", RPCResult::Type::NONE, "", ""},
            RPCResult{"Otherwise", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::NUM, "confirmations", "The number of confirmations"},
                {RPCResult::Type::STR_AMOUNT, "value", "The transaction value in " + CURRENCY_UNIT},
                {RPCResult::Type::OBJ, "scriptPubKey", "", {
                    {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                    {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                    {RPCResult::Type::STR, "type", "The type, eg pubkeyhash"},
                    {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                }},
                {RPCResult::Type::BOOL, "coinbase", "Coinbase or not"},
            }},
        },
        RPCExamples{
            "\nGet unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nView the details\n"
            + HelpExampleCli("gettxout", "\"txid\" 1") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("gettxout", "\"txid\", 1")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);

    UniValue ret(UniValue::VOBJ);

    auto hash{Txid::FromUint256(ParseHashV(request.params[0], "txid"))};
    COutPoint out{hash, request.params[1].getInt<uint32_t>()};
    bool fMempool = true;
    if (!request.params[2].isNull())
        fMempool = request.params[2].get_bool();

    Coin coin;
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    CCoinsViewCache* coins_view = &active_chainstate.CoinsTip();

    if (fMempool) {
        const CTxMemPool& mempool = EnsureMemPool(node);
        LOCK(mempool.cs);
        CCoinsViewMemPool view(coins_view, mempool);
        if (!view.GetCoin(out, coin) || mempool.isSpent(out)) {
            return UniValue::VNULL;
        }
    } else {
        if (!coins_view->GetCoin(out, coin)) {
            return UniValue::VNULL;
        }
    }

    const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(coins_view->GetBestBlock());
    ret.pushKV("bestblock", pindex->GetBlockHash().GetHex());
    if (coin.nHeight == MEMPOOL_HEIGHT) {
        ret.pushKV("confirmations", 0);
    } else {
        ret.pushKV("confirmations", (int64_t)(pindex->nHeight - coin.nHeight + 1));
    }
    ret.pushKV("value", ValueFromAmount(coin.out.nValue));
    UniValue o(UniValue::VOBJ);
    ScriptToUniv(coin.out.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
    ret.pushKV("scriptPubKey", std::move(o));
    ret.pushKV("coinbase", (bool)coin.fCoinBase);

    return ret;
},
    };
}